

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Local.cpp
# Opt level: O3

Point Local::moves_fast_match
                (set<Point,_std::less<Point>,_std::allocator<Point>_> *options,char input,
                bool *reselect,bool get)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  iterator iVar9;
  const_iterator cVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  undefined7 in_register_00000031;
  int iVar13;
  set<Point,_std::less<Point>,_std::allocator<Point>_> matches;
  set<Point,_std::less<Point>,_std::allocator<Point>_> final_matches;
  undefined1 local_c4 [4];
  _Alloc_node local_c0;
  int local_b4;
  ulong local_b0;
  uint local_a4;
  bool *local_a0;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> local_98;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *local_68;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> local_60;
  
  *reselect = false;
  local_a0 = reselect;
  if ((options->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 1) {
    local_98._M_impl._0_1_ =
         (char)(options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color + 0x61;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_98,1);
    plVar8 = (long *)std::ostream::operator<<
                               (poVar7,(short)*(undefined2 *)
                                               ((long)&(options->_M_t)._M_impl.super__Rb_tree_header
                                                       ._M_header._M_left[1]._M_color + 2) + 1);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    p_Var11 = (options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1;
  }
  else {
    uVar12 = CONCAT71(in_register_00000031,input) & 0xffffffff;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(options->_M_t)._M_impl.super__Rb_tree_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68 = options;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      do {
        if ((get & 1U) != 0) {
          cVar3 = getch();
          uVar4 = tolower((int)cVar3);
          uVar12 = (ulong)uVar4;
        }
        cVar3 = (char)uVar12;
        local_b0 = (ulong)(uint)(int)cVar3;
        iVar5 = isspace((int)cVar3);
        get = true;
      } while (iVar5 != 0);
      if (cVar3 == 'u') {
        local_c0._M_t._0_1_ = 0x75;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_c0,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        *local_a0 = true;
        Point::Point((Point *)local_c4,-1,-1);
        goto LAB_0010ec7b;
      }
      local_a4 = (uint)uVar12;
      p_Var11 = (options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var11 != p_Var1) {
        iVar5 = (int)local_b0;
        local_b4 = iVar5 + -0x61;
        cVar10._M_node = &local_98._M_impl.super__Rb_tree_header._M_header;
        do {
          if ((iVar5 - 0x30U < 10) &&
             (iVar5 + -0x31 == (int)(short)*(undefined2 *)((long)&p_Var11[1]._M_color + 2))) {
LAB_0010e9f8:
            local_c0._M_t = &local_98;
            iVar9 = std::
                    _Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                    ::
                    _M_insert_unique_<Point_const&,std::_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>::_Alloc_node>
                              ((_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                                *)local_c0._M_t,cVar10,(Point *)(p_Var11 + 1),&local_c0);
            cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
          }
          else {
            _Var2 = p_Var11[1]._M_color;
            iVar6 = isalpha((int)local_b0);
            if ((iVar6 != 0) && (local_b4 == (short)_Var2)) goto LAB_0010e9f8;
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var1);
      }
      uVar4 = local_a4;
      uVar12 = (ulong)local_a4;
      get = true;
      options = local_68;
    } while (local_98._M_impl.super__Rb_tree_header._M_node_count == 0);
    iVar5 = isalpha((int)local_b0);
    local_c0._M_t._0_1_ = (char)uVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_c0,1);
    if (local_98._M_impl.super__Rb_tree_header._M_node_count == 1) {
      iVar5 = isalpha((int)local_b0);
      cVar3 = '1';
      if (iVar5 == 0) {
        cVar3 = 'a';
      }
      local_c0._M_t._0_1_ =
           cVar3 + *(char *)((long)&local_98._M_impl.super__Rb_tree_header._M_header._M_left[1].
                                    _M_color + (ulong)(iVar5 != 0) * 2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_c0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      p_Var11 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      do {
        std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
        ::clear(&local_60);
        do {
          cVar3 = getch();
          uVar4 = tolower((int)cVar3);
          iVar13 = (int)(char)uVar4;
          iVar6 = isspace(iVar13);
        } while (iVar6 != 0);
        if ((uVar4 & 0xff) == 0x75) {
          local_c0._M_t._0_1_ = 0x75;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_c0,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          *local_a0 = true;
          Point::Point((Point *)local_c4,-1,-1);
          goto LAB_0010ec7b;
        }
        if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_98._M_impl.super__Rb_tree_header) {
          local_b4 = iVar13 + -0x31;
          local_b0 = CONCAT44(local_b0._4_4_,iVar13 + -0x61);
          cVar10._M_node = &local_60._M_impl.super__Rb_tree_header._M_header;
          p_Var11 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            _Var2 = p_Var11[1]._M_color;
            if (((iVar13 - 0x30U < 10) && (iVar5 != 0)) &&
               (local_b4 == (short)*(undefined2 *)((long)&p_Var11[1]._M_color + 2))) {
LAB_0010eb7f:
              local_c0._M_t = &local_60;
              iVar9 = std::
                      _Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                      ::
                      _M_insert_unique_<Point_const&,std::_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>::_Alloc_node>
                                ((_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                                  *)local_c0._M_t,cVar10,(Point *)(p_Var11 + 1),&local_c0);
              cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
            }
            else {
              iVar6 = isalpha(iVar13);
              if (((iVar6 != 0) && (iVar5 == 0)) && ((int)local_b0 == (short)_Var2))
              goto LAB_0010eb7f;
            }
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != &local_98._M_impl.super__Rb_tree_header);
        }
      } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 1);
      local_c0._M_t._0_1_ = (char)uVar4;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_c0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    local_c4 = (undefined1  [4])p_Var11[1]._M_color;
LAB_0010ec7b:
    std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
    ~_Rb_tree(&local_60);
    std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
    ~_Rb_tree(&local_98);
    p_Var11 = (_Base_ptr)local_c4;
  }
  return (Point)p_Var11->_M_color;
}

Assistant:

Point Local::moves_fast_match(const set<Point> &options, char input, bool &reselect, bool get) {
    reselect = false;
#if AUTOFILL
    // Only one option.
    if (options.size() == 1) {
        cout << (char) (options.begin()->get_x() + 'a') << options.begin()->get_y() + 1 << endl;
        return *options.begin();
    }
#endif // AUTOFILL

    set<Point> matches, final_matches;

    // First reduction.
    do {
        do {
            if (get) {
                input = (char) tolower(getch());
            }
            get = true;
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(options.begin(), options.end(), inserter(matches, matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (point.get_x() == input - 'a')));
                });
    } while (matches.empty());

    const bool first_char = isalpha(input);
    cout << input;

#if AUTOFILL
    // Only one option left.
    if (matches.size() == 1) {
        cout << (char) (isalpha(input) ? (char) matches.begin()->get_y() + '0' + 1 :
                        (char) matches.begin()->get_x() + 'a') << endl;
        return *matches.begin();
    }
#endif // AUTOFILL

    // Second reduction.
    do {
        final_matches.clear();

        do {
            input = (char) tolower(getch());
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(matches.begin(), matches.end(), inserter(final_matches, final_matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (first_char) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (!first_char) && (point.get_x() == input - 'a')));
                });
    } while (final_matches.size() != 1);

    cout << input << endl;

    // Final match.
    return *final_matches.begin();
}